

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

void R_CalcTiltedLighting(double lval,double lend,int width)

{
  BYTE *pBVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  BYTE *in_RDX;
  uint uVar7;
  uint uVar8;
  BYTE **ppBVar9;
  double dVar10;
  double dVar11;
  
  pBVar1 = basecolormap->Maps;
  if ((width == 0) || (lval == lend)) {
    if (24.0 <= lval) {
      lval = 24.0;
    }
    iVar6 = planeshade - SUB84(lval + 103079215104.0,0) >> 0x10;
    iVar2 = 0x1f;
    if (iVar6 < 0x1f) {
      iVar2 = iVar6;
    }
    uVar4 = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    pBVar1 = pBVar1 + (uint)(iVar2 << 8);
  }
  else {
    dVar10 = (lend - lval) / (double)width;
    if (24.0 <= lval) {
      dVar11 = 24.0;
      if (lval <= 24.0) {
        dVar11 = lval;
      }
      iVar6 = planeshade - SUB84(dVar11 + 103079215104.0,0) >> 0x10;
      iVar2 = 0x1f;
      if (iVar6 < 0x1f) {
        iVar2 = iVar6;
      }
      uVar4 = 0;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      in_RDX = pBVar1 + (uint)(iVar2 << 8);
      if ((-1 < width) && (24.0 <= lval)) {
        ppBVar9 = tiltlighting;
        uVar5 = 0;
        do {
          *ppBVar9 = in_RDX;
          lval = lval + dVar10;
          uVar4 = uVar5 + 1;
          if ((uint)width <= uVar5) break;
          ppBVar9 = ppBVar9 + 1;
          uVar5 = uVar4;
        } while (24.0 <= lval);
      }
    }
    else {
      uVar4 = 0;
    }
    uVar8 = (uint)uVar4;
    if (24.0 <= lend) {
      dVar11 = 24.0;
      if (lend <= 24.0) {
        dVar11 = lend;
      }
      iVar6 = planeshade - SUB84(dVar11 + 103079215104.0,0) >> 0x10;
      iVar2 = 0x1f;
      if (iVar6 < 0x1f) {
        iVar2 = iVar6;
      }
      iVar6 = 0;
      if (0 < iVar2) {
        iVar6 = iVar2;
      }
      in_RDX = pBVar1 + (uint)(iVar6 << 8);
      if (((int)uVar8 < width) && (24.0 <= lend)) {
        lVar3 = (long)width;
        ppBVar9 = tiltlighting + lVar3;
        do {
          lVar3 = lVar3 + -1;
          *ppBVar9 = in_RDX;
          lend = lend - dVar10;
          width = width - 1;
          if (lVar3 <= (int)uVar8) break;
          ppBVar9 = ppBVar9 + -1;
        } while (24.0 <= lend);
      }
    }
    if (width < 1) goto LAB_00308a1e;
    dVar11 = (double)planeshade * 1.52587890625e-05 - lval;
    dVar10 = (lval - lend) / (double)width;
    if (0.0 <= dVar10) {
      if (dVar11 < 31.0) {
        if ((int)uVar8 <= width && dVar11 < 0.0) {
          ppBVar9 = tiltlighting + (uVar4 & 0xffffffff);
          do {
            *ppBVar9 = pBVar1;
            dVar11 = dVar11 + dVar10;
            iVar2 = (int)uVar4;
            uVar8 = iVar2 + 1;
            if (0.0 <= dVar11) break;
            ppBVar9 = ppBVar9 + 1;
            uVar4 = (ulong)uVar8;
          } while (iVar2 < width);
        }
        if (width < (int)uVar8) {
          return;
        }
        if (dVar11 < 31.0) {
          ppBVar9 = tiltlighting + uVar8;
          uVar7 = uVar8;
          do {
            *ppBVar9 = pBVar1 + (SUB84(dVar11 + 6755399441055744.0,0) << 8);
            uVar8 = uVar7 + 1;
            if (width <= (int)uVar7) break;
            dVar11 = dVar11 + dVar10;
            ppBVar9 = ppBVar9 + 1;
            uVar7 = uVar8;
          } while (dVar11 < 31.0);
        }
        in_RDX = pBVar1 + 0x1f00;
        goto LAB_00308a1e;
      }
      pBVar1 = pBVar1 + 0x1f00;
    }
    else if (1.0 <= dVar11) {
      if (32.0 <= dVar11) {
        if ((int)uVar8 <= width && 32.0 <= dVar11) {
          ppBVar9 = tiltlighting + (uVar4 & 0xffffffff);
          do {
            *ppBVar9 = pBVar1 + 0x1f00;
            dVar11 = dVar11 + dVar10;
            iVar2 = (int)uVar4;
            uVar8 = iVar2 + 1;
            if (dVar11 < 32.0) break;
            ppBVar9 = ppBVar9 + 1;
            uVar4 = (ulong)uVar8;
          } while (iVar2 < width);
        }
        uVar4 = (ulong)uVar8;
        if (width < (int)uVar8) {
          return;
        }
      }
      iVar2 = (int)uVar4;
      if ((iVar2 <= width) && (0.0 <= dVar11)) {
        ppBVar9 = tiltlighting + iVar2;
        uVar5 = (long)iVar2;
        do {
          uVar4 = uVar5 + 1;
          *ppBVar9 = pBVar1 + (SUB84(dVar11 + 6755399441055744.0,0) << 8);
          if ((long)(ulong)(uint)width <= (long)uVar5) break;
          dVar11 = dVar11 + dVar10;
          ppBVar9 = ppBVar9 + 1;
          uVar5 = uVar4;
        } while (0.0 <= dVar11);
      }
    }
  }
  uVar8 = (uint)uVar4;
  in_RDX = pBVar1;
LAB_00308a1e:
  if ((int)uVar8 <= width) {
    lVar3 = 0;
    do {
      tiltlighting[lVar3 + (int)uVar8] = in_RDX;
      lVar3 = lVar3 + 1;
    } while ((width - uVar8) + 1 != (int)lVar3);
  }
  return;
}

Assistant:

void R_CalcTiltedLighting (double lval, double lend, int width)
{
	double lstep;
	BYTE *lightfiller;
	BYTE *basecolormapdata = basecolormap->Maps;
	int i = 0;

	if (width == 0 || lval == lend)
	{ // Constant lighting
		lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
	}
	else
	{
		lstep = (lend - lval) / width;
		if (lval >= MAXLIGHTVIS)
		{ // lval starts "too bright".
			lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
			for (; i <= width && lval >= MAXLIGHTVIS; ++i)
			{
				tiltlighting[i] = lightfiller;
				lval += lstep;
			}
		}
		if (lend >= MAXLIGHTVIS)
		{ // lend ends "too bright".
			lightfiller = basecolormapdata + (GETPALOOKUP(lend, planeshade) << COLORMAPSHIFT);
			for (; width > i && lend >= MAXLIGHTVIS; --width)
			{
				tiltlighting[width] = lightfiller;
				lend -= lstep;
			}
		}
		if (width > 0)
		{
			lval = FIXED2DBL(planeshade) - lval;
			lend = FIXED2DBL(planeshade) - lend;
			lstep = (lend - lval) / width;
			if (lstep < 0)
			{ // Going from dark to light
				if (lval < 1.)
				{ // All bright
					lightfiller = basecolormapdata;
				}
				else
				{
					if (lval >= NUMCOLORMAPS)
					{ // Starts beyond the dark end
						BYTE *clight = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
						while (lval >= NUMCOLORMAPS && i <= width)
						{
							tiltlighting[i++] = clight;
							lval += lstep;
						}
						if (i > width)
							return;
					}
					while (i <= width && lval >= 0)
					{
						tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
						lval += lstep;
					}
					lightfiller = basecolormapdata;
				}
			}
			else
			{ // Going from light to dark
				if (lval >= (NUMCOLORMAPS-1))
				{ // All dark
					lightfiller = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
				}
				else
				{
					while (lval < 0 && i <= width)
					{
						tiltlighting[i++] = basecolormapdata;
						lval += lstep;
					}
					if (i > width)
						return;
					while (i <= width && lval < (NUMCOLORMAPS-1))
					{
						tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
						lval += lstep;
					}
					lightfiller = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
				}
			}
		}
	}
	for (; i <= width; i++)
	{
		tiltlighting[i] = lightfiller;
	}
}